

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainGLBase.hpp
# Opt level: O0

bool __thiscall
Diligent::SwapChainGLBase<Diligent::ISwapChainGL>::Resize
          (SwapChainGLBase<Diligent::ISwapChainGL> *this,Uint32 NewWidth,Uint32 NewHeight,
          SURFACE_TRANSFORM NewPreTransform,Int32 param_4)

{
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  DeviceContextGLImpl *this_00;
  TextureViewGLImpl *this_01;
  ITexture *Ptr;
  TextureBaseGL *pTexture;
  RenderDeviceGLImpl *pRenderDeviceGL;
  undefined4 in_register_0000000c;
  char (*Args_1) [167];
  undefined1 local_a0 [8];
  string _msg_1;
  bool RenderTargetsReset;
  TextureBaseGL *pCurrentBackBuffer;
  DeviceContextGLImpl *pImmediateCtxGL;
  RefCntAutoPtr<Diligent::IDeviceContext> pDeviceContext;
  char *local_50;
  undefined1 local_48 [8];
  string _msg;
  Int32 param_5_local;
  SURFACE_TRANSFORM NewPreTransform_local;
  Uint32 NewHeight_local;
  Uint32 NewWidth_local;
  SwapChainGLBase<Diligent::ISwapChainGL> *this_local;
  
  Args_1 = (char (*) [167])CONCAT44(in_register_0000000c,NewPreTransform);
  _msg.field_2._8_4_ = param_4;
  if ((NewPreTransform != SURFACE_TRANSFORM_OPTIMAL) &&
     (NewPreTransform != SURFACE_TRANSFORM_IDENTITY)) {
    _msg.field_2._12_4_ = NewPreTransform;
    local_50 = GetSurfaceTransformString(NewPreTransform);
    FormatString<char_const*,char[167]>
              ((string *)local_48,(Diligent *)&local_50,
               (char **)
               " is not an allowed pretransform because OpenGL swap chains only support identity transform. Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY."
               ,Args_1);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  _msg.field_2._12_4_ = 0;
  bVar2 = SwapChainBase<Diligent::ISwapChainGL>::Resize
                    (&this->super_SwapChainBase<Diligent::ISwapChainGL>,NewWidth,NewHeight,
                     SURFACE_TRANSFORM_OPTIMAL,0);
  if (bVar2) {
    bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                      ((RefCntAutoPtr *)&this->m_pRenderTargetView);
    if (bVar2) {
      RefCntWeakPtr<Diligent::IDeviceContext>::Lock
                ((RefCntWeakPtr<Diligent::IDeviceContext> *)&pImmediateCtxGL);
      bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pImmediateCtxGL);
      if (bVar2) {
        this_00 = RefCntAutoPtr<Diligent::IDeviceContext>::RawPtr<Diligent::DeviceContextGLImpl>
                            ((RefCntAutoPtr<Diligent::IDeviceContext> *)&pImmediateCtxGL);
        this_01 = RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator->(&this->m_pRenderTargetView)
        ;
        Ptr = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture
                        (&this_01->super_TextureViewBase<Diligent::EngineGLImplTraits>);
        pTexture = ClassPtrCast<Diligent::TextureBaseGL,Diligent::ITexture>(Ptr);
        _msg_1.field_2._M_local_buf[0xf] =
             DeviceContextBase<Diligent::EngineGLImplTraits>::UnbindTextureFromFramebuffer
                       (&this_00->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pTexture,
                        false);
        if (((bool)_msg_1.field_2._M_local_buf[0xf]) && ((Resize::IsFirstTime & 1U) != 0)) {
          FormatString<char[165]>
                    ((string *)local_a0,
                     (char (*) [165])
                     "Resizing the swap chain requires back and depth-stencil buffers to be unbound from the device context. An application should use SetRenderTargets() to restore them."
                    );
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar3 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(0,uVar3,0);
          }
          std::__cxx11::string::~string((string *)local_a0);
          Resize::IsFirstTime = false;
        }
      }
      RefCntAutoPtr<Diligent::IDeviceContext>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceContext> *)&pImmediateCtxGL);
    }
    pRenderDeviceGL =
         RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceGLImpl>
                   (&(this->super_SwapChainBase<Diligent::ISwapChainGL>).m_pRenderDevice);
    CreateDummyBuffers(this,pRenderDeviceGL);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Resize(Uint32 NewWidth, Uint32 NewHeight, SURFACE_TRANSFORM NewPreTransform, Int32 /*To be different from virtual function*/)
    {
        if (NewPreTransform != SURFACE_TRANSFORM_OPTIMAL &&
            NewPreTransform != SURFACE_TRANSFORM_IDENTITY)
        {
            LOG_WARNING_MESSAGE(GetSurfaceTransformString(NewPreTransform),
                                " is not an allowed pretransform because OpenGL swap chains only support identity transform. "
                                "Use SURFACE_TRANSFORM_OPTIMAL (recommended) or SURFACE_TRANSFORM_IDENTITY.");
        }
        NewPreTransform = SURFACE_TRANSFORM_OPTIMAL;

        if (TSwapChainBase::Resize(NewWidth, NewHeight, NewPreTransform))
        {
            if (m_pRenderTargetView)
            {
                if (auto pDeviceContext = this->m_wpDeviceContext.Lock())
                {
                    auto* pImmediateCtxGL = pDeviceContext.template RawPtr<DeviceContextGLImpl>();
                    // Unbind the back buffer to be consistent with other backends
                    auto* pCurrentBackBuffer = ClassPtrCast<TextureBaseGL>(m_pRenderTargetView->GetTexture());
                    auto  RenderTargetsReset = pImmediateCtxGL->UnbindTextureFromFramebuffer(pCurrentBackBuffer, false);
                    if (RenderTargetsReset)
                    {
                        LOG_INFO_MESSAGE_ONCE("Resizing the swap chain requires back and depth-stencil buffers to be unbound from the device context. "
                                              "An application should use SetRenderTargets() to restore them.");
                    }
                }
            }

            CreateDummyBuffers(this->m_pRenderDevice.template RawPtr<RenderDeviceGLImpl>());
            return true;
        }

        return false;
    }